

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O3

void pnga_step_max_patch(Integer g_a,Integer *alo,Integer *ahi,Integer g_b,Integer *blo,Integer *bhi
                        ,void *result)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  logical lVar4;
  Integer IVar5;
  double *val;
  long lVar6;
  ulong icode;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  Integer *ahi_00;
  bool bVar16;
  ulong uVar17;
  char *A_ptr;
  undefined8 local_648;
  char *local_640;
  ulong local_638;
  Integer g_c;
  Integer andim;
  Integer andim_1;
  Integer *local_618;
  Integer bndim;
  Integer atype;
  Integer atype_1;
  int local_5f4;
  float fresult;
  int iresult;
  Integer loA [7];
  long lresult;
  double dresult;
  Integer hiA [7];
  Integer compatible;
  Integer btype;
  Integer ldA [7];
  long alStack_500 [9];
  Integer local_4b8;
  long local_4b0;
  Integer aIStack_4a8 [6];
  Integer bunit [7];
  long lStack_430;
  undefined1 local_428 [48];
  Integer bdims [7];
  Integer adims [7];
  Integer adims_1 [7];
  Integer index [7];
  
  iVar2 = _ga_sync_end;
  bVar16 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_648 = g_b;
  local_618 = ahi;
  if (bVar16) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_step_max_patch_");
  uVar17 = local_648;
  pnga_check_handle(local_648,"ga_step_max_patch_");
  pnga_inquire(g_a,&atype,&andim,adims);
  pnga_inquire(uVar17,&btype,&bndim,bdims);
  if (atype != btype) {
    pnga_error(" ga_step_max_patch_: types mismatch ",0);
  }
  lVar6 = andim;
  if (0 < andim) {
    lVar14 = 0;
    do {
      if ((alo[lVar14] < 1) || (adims[lVar14] < local_618[lVar14])) {
        pnga_error("g_a indices out of range ",g_a);
        lVar6 = andim;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < lVar6);
  }
  lVar14 = bndim;
  if (0 < bndim) {
    lVar15 = 0;
    do {
      if ((blo[lVar15] < 1) || (bdims[lVar15] < bhi[lVar15])) {
        pnga_error("g_b indices out of range ",local_648);
        lVar14 = bndim;
      }
      lVar15 = lVar15 + 1;
      lVar6 = andim;
    } while (lVar15 < lVar14);
  }
  ahi_00 = local_618;
  lVar15 = 1;
  lVar9 = 1;
  if (0 < lVar6) {
    lVar10 = 0;
    do {
      lVar9 = lVar9 * ((local_618[lVar10] - alo[lVar10]) + 1);
      lVar10 = lVar10 + 1;
    } while (lVar6 != lVar10);
  }
  if (0 < lVar14) {
    lVar15 = 1;
    lVar10 = 0;
    do {
      lVar15 = lVar15 * ((bhi[lVar10] - blo[lVar10]) + 1);
      lVar10 = lVar10 + 1;
    } while (lVar14 != lVar10);
  }
  if (lVar15 != lVar9) {
    pnga_error(" ga_step_max_patch_ capacities of patches do not match ",0);
    lVar14 = bndim;
    lVar6 = andim;
  }
  lVar4 = pnga_comp_patch(lVar6,alo,ahi_00,lVar14,blo,bhi);
  compatible = (Integer)(lVar4 != 0);
  IVar5 = pnga_type_f2c(0x3f2);
  pnga_gop(IVar5,&compatible,1,"&&");
  if (compatible == 0) {
    pnga_error(" ga_step_max_patch_ mismatched patchs ",0);
  }
  switch(atype) {
  case 0x3e9:
    val = (double *)&iresult;
    break;
  case 0x3ea:
    val = (double *)&lresult;
    break;
  case 0x3eb:
    val = (double *)&fresult;
    break;
  case 0x3ec:
    val = &dresult;
    break;
  default:
    pcVar11 = "Ga_step_max_patch_: wrong data type.";
    goto LAB_0012a5f4;
  case 0x3ee:
  case 0x3ef:
    pcVar11 = "Ga_step_max_patch_: unavalable for complex datatype.";
LAB_0012a5f4:
    pnga_error(pcVar11,atype);
    val = (double *)0x0;
  }
  if (g_a != local_648) {
    IVar5 = has_negative_elem(g_a,alo,ahi_00);
    if (IVar5 == 1) {
      pnga_error("ga_step_max_patch_: g_a has negative element.",-1);
    }
    pnga_duplicate(g_a,&g_c,"Temp");
    if (g_c == 0) {
      pnga_error("ga_step_max_patch_:fail to duplicate array c",g_a);
    }
    ngai_elem2_patch_(g_a,alo,ahi_00,local_648,blo,bhi,g_c,alo,ahi_00,9);
    IVar5 = g_c;
    pnga_nodeid();
    bVar16 = _ga_sync_begin != 0;
    local_5f4 = _ga_sync_end;
    _ga_sync_begin = 1;
    _ga_sync_end = 1;
    if (bVar16) {
      pnga_sync();
    }
    pnga_check_handle(IVar5,"gai_elem3_patch_");
    pnga_inquire(IVar5,&atype_1,&andim_1,adims_1);
    pnga_total_blocks(IVar5);
    if (0 < andim_1) {
      lVar14 = 0;
      lVar6 = andim_1;
      do {
        if ((alo[lVar14] < 1) || (adims_1[lVar14] < ahi_00[lVar14])) {
          pnga_error("g_a indices out of range ",IVar5);
          lVar6 = andim_1;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < lVar6);
    }
    pnga_local_iterator_init(IVar5,(_iterator_hdl *)index);
    iVar3 = pnga_local_iterator_next((_iterator_hdl *)index,loA,hiA,&A_ptr,ldA);
    lVar6 = andim_1;
    while (iVar3 != 0) {
      andim_1 = lVar6;
      if (0 < lVar6) {
        memcpy(alStack_500 + 1,loA,lVar6 * 8);
      }
      lVar4 = pnga_patch_intersect(alo,ahi_00,loA,hiA,lVar6);
      if (lVar4 != 0) {
        if (0 < andim_1) {
          lVar6 = 0;
LAB_0012a82a:
          if (loA[lVar6] <= alStack_500[lVar6 + 1]) goto code_r0x0012a83c;
          if (andim_1 == 1) {
            lVar6 = 1;
            lVar14 = 0;
          }
          else {
            lVar6 = 1;
            lVar15 = 0;
            lVar14 = 0;
            do {
              lVar14 = lVar14 + (loA[lVar15] - alStack_500[lVar15 + 1]) * lVar6;
              lVar6 = lVar6 * ldA[lVar15];
              lVar15 = lVar15 + 1;
            } while (andim_1 + -1 != lVar15);
          }
          if (atype_1 - 0x3e9U < 7) {
            lVar14 = (*(long *)(&fresult + andim_1 * 2) - alStack_500[andim_1]) * lVar6 + lVar14;
            switch(atype_1) {
            case 0x3e9:
            case 0x3eb:
              lVar14 = lVar14 * 4;
              break;
            default:
              lVar14 = lVar14 * 8;
              break;
            case 0x3ed:
              goto switchD_0012a8ed_caseD_3ed;
            case 0x3ef:
              lVar14 = lVar14 * 0x10;
            }
            A_ptr = A_ptr + lVar14;
          }
          else {
switchD_0012a8ed_caseD_3ed:
            pnga_error(" wrong data type ",atype_1);
          }
LAB_0012a904:
          local_640 = A_ptr;
          lVar6 = 1;
          if (andim_1 < 2) {
            local_648 = (ulong)local_648._4_4_ << 0x20;
          }
          else {
            lVar14 = 1;
            do {
              lVar6 = lVar6 * ((hiA[lVar14] - loA[lVar14]) + 1);
              lVar14 = lVar14 + 1;
            } while (andim_1 != lVar14);
            local_648 = CONCAT44(local_648._4_4_,(int)CONCAT71((int7)((ulong)lVar14 >> 8),1));
          }
          goto LAB_0012a952;
        }
        local_640 = A_ptr;
        lVar6 = 1;
        local_648 = local_648 & 0xffffffff00000000;
LAB_0012a952:
        IVar5 = andim_1;
        lStack_430 = 0;
        bunit[0] = 1;
        bunit[1] = 1;
        local_4b8 = ldA[0];
        lVar14 = ldA[0] * ldA[1];
        local_4b0 = lVar14;
        A_ptr = local_640;
        local_638 = atype_1;
        if (2 < andim_1) {
          memset(local_428,0,andim_1 * 8 - 0x10);
          lVar15 = 2;
          lVar9 = 1;
          do {
            lVar9 = lVar9 * ((hiA[lVar15 + -1] - *(long *)(&fresult + lVar15 * 2)) + 1);
            lVar14 = lVar14 * ldA[lVar15];
            bunit[lVar15] = lVar9;
            (&local_4b8)[lVar15] = lVar14;
            lVar15 = lVar15 + 1;
          } while (IVar5 != lVar15);
        }
        ahi_00 = local_618;
        if (0 < lVar6) {
          iVar3 = (int)local_638;
          icode = local_638 & 0xffffffff;
          pcVar11 = (char *)0x0;
          lVar14 = 0;
          uVar17 = local_638;
          do {
            if ((char)local_648 == '\0') {
              lVar15 = 0;
            }
            else {
              lVar9 = 0;
              lVar15 = 0;
              do {
                lVar15 = lVar15 + (&local_4b8)[lVar9] * *(long *)(local_428 + lVar9 * 8 + -8);
                lVar12 = *(long *)(local_428 + lVar9 * 8 + -8) +
                         (ulong)((lVar14 + 1) % bunit[lVar9 + 1] == 0);
                lVar10 = 0;
                if (lVar12 <= hiA[lVar9 + 1] - loA[lVar9 + 1]) {
                  lVar10 = lVar12;
                }
                *(long *)(local_428 + lVar9 * 8 + -8) = lVar10;
                lVar9 = lVar9 + 1;
              } while (IVar5 + -1 != lVar9);
            }
            switch(uVar17) {
            case 0x3e9:
              pcVar11 = local_640 + lVar15 * 4;
              uVar13 = ((int)hiA[0] - (int)loA[0]) + 1;
LAB_0012aadd:
              if (0 < (int)uVar13) {
                uVar8 = 0;
                do {
                  if (0 < *(int *)(pcVar11 + uVar8 * 4)) {
                    pcVar1 = pcVar11 + uVar8 * 4;
                    pcVar1[0] = '\x01';
                    pcVar1[1] = '\0';
                    pcVar1[2] = '\0';
                    pcVar1[3] = -0x80;
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar13 != uVar8);
              }
              break;
            case 0x3ea:
              pcVar11 = local_640 + lVar15 * 8;
              uVar13 = ((int)hiA[0] - (int)loA[0]) + 1;
LAB_0012ab8f:
              if (0 < (int)uVar13) {
                uVar8 = 0;
                do {
                  if (0 < *(long *)(pcVar11 + uVar8 * 8)) {
                    pcVar1 = pcVar11 + uVar8 * 8;
                    pcVar1[0] = '\x01';
                    pcVar1[1] = '\0';
                    pcVar1[2] = '\0';
                    pcVar1[3] = '\0';
                    pcVar1[4] = '\0';
                    pcVar1[5] = '\0';
                    pcVar1[6] = '\0';
                    pcVar1[7] = -0x80;
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar13 != uVar8);
              }
              break;
            case 0x3eb:
              pcVar11 = local_640 + lVar15 * 4;
              uVar13 = ((int)hiA[0] - (int)loA[0]) + 1;
LAB_0012ac2b:
              if (0 < (int)uVar13) {
                uVar8 = 0;
                do {
                  if (0.0 < *(float *)(pcVar11 + uVar8 * 4)) {
                    pcVar1 = pcVar11 + uVar8 * 4;
                    pcVar1[0] = -0x3e;
                    pcVar1[1] = -0x43;
                    pcVar1[2] = -0x10;
                    pcVar1[3] = -4;
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar13 != uVar8);
              }
              break;
            case 0x3ec:
              pcVar11 = local_640 + lVar15 * 8;
              uVar13 = ((int)hiA[0] - (int)loA[0]) + 1;
LAB_0012ab46:
              if (0 < (int)uVar13) {
                uVar8 = 0;
                do {
                  if (0.0 < *(double *)(pcVar11 + uVar8 * 8)) {
                    pcVar1 = pcVar11 + uVar8 * 8;
                    pcVar1[0] = '3';
                    pcVar1[1] = 't';
                    pcVar1[2] = -0x54;
                    pcVar1[3] = '<';
                    pcVar1[4] = '\x1f';
                    pcVar1[5] = '{';
                    pcVar1[6] = -0x54;
                    pcVar1[7] = -1;
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar13 != uVar8);
              }
              break;
            default:
              pnga_error(" ngai_elem3_patch_: wrong data type ",uVar17);
              if ((int)local_638 - 0x3e9U < 7) {
                uVar13 = ((int)hiA[0] - (int)loA[0]) + 1;
                uVar17 = local_638;
                switch((int)local_638) {
                case 0x3e9:
                  goto LAB_0012aadd;
                case 0x3ea:
                  goto LAB_0012ab8f;
                case 0x3ec:
                  goto LAB_0012ab46;
                case 0x3ed:
                  break;
                default:
                  pnga_error("do_stepmax:wrong data type",icode);
                case 0x3eb:
                  uVar17 = local_638;
                  goto LAB_0012ac2b;
                }
              }
              pnga_error("do_stepmax:wrong data type",(long)iVar3);
              uVar17 = local_638;
            }
            lVar14 = lVar14 + 1;
            ahi_00 = local_618;
          } while (lVar14 != lVar6);
        }
      }
      iVar3 = pnga_local_iterator_next((_iterator_hdl *)index,loA,hiA,&A_ptr,ldA);
      lVar6 = andim_1;
    }
    if (local_5f4 != 0) {
      pnga_sync();
    }
    pnga_select_elem(g_c,"max",val,index);
    switch(atype) {
    case 0x3e9:
      iVar3 = -iresult;
      if (0 < iresult) {
        iVar3 = iresult;
      }
      *(int *)result = iVar3;
      break;
    case 0x3ea:
      lVar6 = -lresult;
      if (0 < lresult) {
        lVar6 = lresult;
      }
      *(long *)result = lVar6;
      break;
    case 0x3eb:
      uVar13 = -(uint)(-fresult <= fresult);
      *(uint *)result = ~uVar13 & (uint)-fresult | (uint)fresult & uVar13;
      break;
    case 0x3ec:
      uVar17 = -(ulong)(-dresult <= dresult);
      *(ulong *)result = ~uVar17 & (ulong)-dresult | (ulong)dresult & uVar17;
      break;
    default:
      pcVar11 = "Ga_step_max_patch_: wrong data type.";
      goto LAB_0012ae4f;
    case 0x3ee:
    case 0x3ef:
      pcVar11 = "Ga_step_max_patch_: unavailable for complex datatype.";
LAB_0012ae4f:
      pnga_error(pcVar11,atype);
    }
    pnga_destroy(g_c);
    goto LAB_0012aea9;
  }
  switch(atype) {
  case 0x3e9:
    *(undefined4 *)result = 0x7fffffff;
    goto LAB_0012aea9;
  case 0x3ea:
    uVar7 = 0x7fffffffffffffff;
    break;
  case 0x3eb:
    *(undefined4 *)result = 0x7cf0bdc2;
    goto LAB_0012aea9;
  case 0x3ec:
    uVar7 = 0x7fac7b1f3cac7433;
    break;
  default:
    pcVar11 = "Ga_step_max_patch_: wrong data type.";
    goto LAB_0012ae41;
  case 0x3ee:
  case 0x3ef:
    pcVar11 = "Ga_step_max_patch_: unavailable for complex datatype.";
LAB_0012ae41:
    pnga_error(pcVar11,atype);
    goto LAB_0012aea9;
  }
  *(undefined8 *)result = uVar7;
LAB_0012aea9:
  if (iVar2 != 0) {
    pnga_sync();
  }
  return;
code_r0x0012a83c:
  lVar6 = lVar6 + 1;
  if (andim_1 == lVar6) goto LAB_0012a904;
  goto LAB_0012a82a;
}

Assistant:

void pnga_step_max_patch(g_a,  alo, ahi, g_b,  blo, bhi, result) 
     Integer g_a, *alo, *ahi;    /* patch of g_a */
     Integer g_b, *blo, *bhi;    /* patch of g_b */
     void *result;
#if 0
     Integer op; /* operations */
#endif

{
  double  dresult;
  long    lresult;
  Integer atype;
  Integer andim, adims[MAXDIM];
  Integer btype;
  Integer bndim, bdims[MAXDIM];
  Integer index[MAXDIM];
  /* Integer num_blocks_a, num_blocks_b; */
  /* double result = -1; */
  Integer g_c;
  int iresult;
  Integer atotal,btotal;
  float   fresult;
  int local_sync_begin,local_sync_end;
  int i;
  Integer compatible;
  void *sresult = NULL;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  /* Check for valid ga handles. */

  pnga_check_handle(g_a, "ga_step_max_patch_");
  pnga_check_handle(g_b, "ga_step_max_patch_");


  /* get chacteristics of the input ga patches */

  pnga_inquire(g_a, &atype, &andim, adims);
  pnga_inquire(g_b, &btype, &bndim, bdims);
  /* num_blocks_a = pnga_total_blocks(g_a); */
  /* num_blocks_b = pnga_total_blocks(g_b); */

  /* Check for matching types. */
  if(atype != btype) pnga_error(" ga_step_max_patch_: types mismatch ", 0L); 

  /* check if patch indices and dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", g_a);
  for(i=0; i<bndim; i++)
    if(blo[i] <= 0 || bhi[i] > bdims[i])
      pnga_error("g_b indices out of range ", g_b);

  /* check if numbers of elements in patches match each other */
  atotal = 1; for(i=0; i<andim; i++) atotal *= (ahi[i] - alo[i] + 1);
  btotal = 1; for(i=0; i<bndim; i++) btotal *= (bhi[i] - blo[i] + 1);

  if(btotal != atotal)
    pnga_error(" ga_step_max_patch_ capacities of patches do not match ", 0L);

  /* test if patches match */
  if(pnga_comp_patch(andim, alo, ahi, bndim, blo, bhi)) compatible = 1;
  else compatible = 0;
  /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
  pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
  if(!compatible) {
    pnga_error(" ga_step_max_patch_ mismatched patchs ",0);
  }

  switch (atype)
  {
    case C_INT:
      sresult = &iresult;
      break;
    case C_DCPL:
    case C_SCPL:
      pnga_error("Ga_step_max_patch_: unavalable for complex datatype.", 
          atype);
      break;
    case C_DBL:
      sresult = &dresult;
      break;
    case C_FLOAT:
      sresult = &fresult;
      break;
    case C_LONG:
      sresult = &lresult;
      break;
    default:
      pnga_error("Ga_step_max_patch_: wrong data type.", atype);
  }

  if(g_a == g_b) {
    /* It used to say 1, but if ga and gb are the same, and 
       ga is nonnegative then any number of multiples of gb
       can be added to ga still leaving it nonnegative.
     *result = (double)1.0;
     */
    switch (atype)
    {
      case C_INT:
        *(int*)result = GA_INFINITY_I;
        break;
      case C_DCPL:
      case C_SCPL:
        pnga_error("Ga_step_max_patch_: unavailable for complex datatype.", 
            atype);
        break;
      case C_DBL:
        *(double*)result = GA_INFINITY_D;
        break;
      case C_FLOAT:
        *(float*)result = GA_INFINITY_F;
        break;
      case C_LONG:
        *(long*)result = GA_INFINITY_L;
        break;
      default:
        pnga_error("Ga_step_max_patch_: wrong data type.", atype);
    }
  } else {
    /*Now look at each element of the array g_a. 
      If an element of g_a is negative, then simply return */ 
    if(has_negative_elem(g_a, alo, ahi) == 1)
      pnga_error("ga_step_max_patch_: g_a has negative element.", -1);

    /*duplicate an array c to hold the temparate result = g_a/g_b; */
    pnga_duplicate(g_a, &g_c, "Temp");
    if(g_c==0)
      pnga_error("ga_step_max_patch_:fail to duplicate array c", g_a);

    /*
       pnga_elem_divide_patch(g_a, alo, ahi, g_b, blo, bhi, g_c, alo, ahi);
     */
    pnga_elem_step_divide_patch(g_a, alo, ahi, g_b, blo, bhi, 
        g_c, alo, ahi);

    /*Now look at each element of the array g_c. If an element of g_c is positive,
      then replace it with -GA_INFINITY */ 
    ngai_elem3_patch_(g_c, alo, ahi, OP_STEPMAX);  
    /*Then, we will select the maximum of the array g_c*/ 
    pnga_select_elem(g_c, "max", sresult, index); 
    switch (atype)
    {
      case C_INT:
        *(int*)result = GA_ABS(iresult);
        break;
      case C_DCPL:
      case C_SCPL:
        pnga_error("Ga_step_max_patch_: unavailable for complex datatype.", 
            atype);
        break;
      case C_DBL:
        *(double*)result = GA_ABS(dresult);
        break;
      case C_FLOAT:
        *(float*)result = GA_ABS(fresult);
        break;
      case C_LONG:
        *(long*)result = GA_ABS(lresult);
        break;
      default:
        pnga_error("Ga_step_max_patch_: wrong data type.", atype);
    }
    pnga_destroy(g_c);
  }
  if(local_sync_end)pnga_sync();
}